

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::CScanner(CScanner *this,IErrorHandler *errorHandler)

{
  IErrorHandler *errorHandler_local;
  CScanner *this_local;
  
  CParser::CParser(&this->super_CParser,errorHandler);
  Reset(this);
  return;
}

Assistant:

CScanner::CScanner( IErrorHandler* errorHandler ) :
	CParser( errorHandler )
{
	Reset();
}